

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_BYTECODE_const_array_varname(Context *ctx,int base,int size)

{
  char *pcVar1;
  char local_58 [8];
  char buf [64];
  int size_local;
  int base_local;
  Context *ctx_local;
  
  buf._56_4_ = size;
  buf._60_4_ = base;
  snprintf(local_58,0x40,"c_array_%d_%d",(ulong)(uint)base,(ulong)(uint)size);
  pcVar1 = StrDup(ctx,local_58);
  return pcVar1;
}

Assistant:

static const char *get_BYTECODE_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    snprintf(buf, sizeof (buf), "c_array_%d_%d", base, size);
    return StrDup(ctx, buf);
}